

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>::operator()
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>
           *this,Boxed_Value *param)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Boxed_Value BVar3;
  array<chaiscript::Boxed_Value,_1UL> params;
  Type_Conversions_State state_1;
  Type_Conversions_State state;
  undefined1 local_100 [16];
  undefined1 local_f0 [24];
  pointer local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Rb_tree_node_base _Stack_c0;
  size_t sStack_a0;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  local_98;
  atomic_size_t aStack_68;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  local_60;
  Conversion_Saves local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_100._0_8_ = *in_RDX;
  local_100._8_8_ = in_RDX[1];
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_)->_M_use_count + 1;
    }
  }
  p_Var1 = param[1].m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Stack_c0._M_left = &_Stack_c0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_c0._M_color = _S_red;
    _Stack_c0._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    sStack_a0 = 0;
    local_98._M_impl._0_8_ = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    aStack_68.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0._8_8_ = &local_30;
    local_30.enabled = false;
    local_30.saves.
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_30.saves.
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_30.saves.
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0._0_8_ = &local_d0;
    local_f0._16_8_ = local_100;
    local_d8 = (pointer)local_f0;
    _Stack_c0._M_right = _Stack_c0._M_left;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::call
              ((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                *)this,(Function_Params *)param,(Type_Conversions_State *)(local_f0 + 0x10));
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_30.saves);
    std::
    _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::~_Rb_tree(&local_98);
    std::
    _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
                 *)&local_c8);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_c8 = p_Var1 + 10;
    local_f0._0_8_ = local_100;
    local_f0._8_8_ = local_f0;
    local_d0 = p_Var1;
    BVar3 = Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::
            call((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                  *)this,(Function_Params *)param,(Type_Conversions_State *)local_f0);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    _Var2._M_pi = extraout_RDX_00;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }